

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,GenerateBlockSyntax *syntax)

{
  size_t sVar1;
  SyntaxNode *node;
  size_t sVar2;
  uint uVar3;
  Token token;
  
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::emplace_back<>(&(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
  sVar1 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar1);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar1);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::pop_back(&(this->moduleDeclStack).
              super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  return;
}

Assistant:

void handle(const GenerateBlockSyntax& syntax) {
        moduleDeclStack.emplace_back();
        visitDefault(syntax);
        moduleDeclStack.pop_back();
    }